

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O0

void MacProj::Initialize(void)

{
  bool bVar1;
  int iVar2;
  reference pbVar3;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  old_mac;
  ParmParse pp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb48;
  Print *in_stack_fffffffffffffb50;
  string *in_stack_fffffffffffffb58;
  ParmParse *in_stack_fffffffffffffb60;
  allocator *os_;
  undefined4 in_stack_fffffffffffffb80;
  string *in_stack_fffffffffffffb98;
  string *in_stack_fffffffffffffbb8;
  Print *in_stack_fffffffffffffbc0;
  int in_stack_fffffffffffffbcc;
  double *in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbd8;
  ParmParse *in_stack_fffffffffffffbe0;
  string local_2e0 [32];
  _Self local_2c0;
  _Self local_2b8;
  undefined1 *local_2b0;
  allocator local_119;
  string local_118 [32];
  undefined1 local_f8 [55];
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [120];
  char *local_10;
  char *local_8;
  
  if (((anonymous_namespace)::initialized & 1) == 0) {
    (anonymous_namespace)::umac_periodic_test_Tol = 0x3ddb7cdfd9d7bdbb;
    verbose = 0;
    mac_tol = 1e-12;
    mac_abs_tol = 1e-16;
    mac_sync_tol = 1e-10;
    do_outflow_bcs = 1;
    check_umac_periodicity = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"mac_proj",&local_89);
    amrex::ParmParse::ParmParse(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    amrex::ParmParse::query
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0,
               in_stack_fffffffffffffbcc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"v",&local_c1);
    iVar2 = amrex::ParmParse::countname
                      ((ParmParse *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    if (0 < iVar2) {
      local_8 = "mac_proj.v found in inputs. To set verbosity use mac_proj.verbose";
      amrex::Abort_host((char *)in_stack_fffffffffffffb60);
    }
    os_ = &local_119;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"mac",os_);
    amrex::ParmParse::getEntries(in_stack_fffffffffffffb98);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x84535a);
    if (!bVar1) {
      amrex::OutStream();
      amrex::Print::Print((Print *)CONCAT44(iVar2,in_stack_fffffffffffffb80),(ostream *)os_);
      amrex::Print::operator<<(in_stack_fffffffffffffb50,(char (*) [71])in_stack_fffffffffffffb48);
      amrex::Print::operator<<(in_stack_fffffffffffffb50,(char (*) [58])in_stack_fffffffffffffb48);
      amrex::Print::~Print(in_stack_fffffffffffffbc0);
      local_2b0 = local_f8;
      local_2b8._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffb48);
      local_2c0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffb48);
      while (bVar1 = std::operator!=(&local_2b8,&local_2c0), bVar1) {
        pbVar3 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffb50);
        std::__cxx11::string::string(local_2e0,(string *)pbVar3);
        in_stack_fffffffffffffb60 = (ParmParse *)amrex::OutStream();
        amrex::Print::Print((Print *)CONCAT44(iVar2,in_stack_fffffffffffffb80),(ostream *)os_);
        amrex::Print::operator<<(in_stack_fffffffffffffb50,(char (*) [3])in_stack_fffffffffffffb48);
        in_stack_fffffffffffffb50 =
             amrex::Print::operator<<(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
        amrex::Print::operator<<(in_stack_fffffffffffffb50,(char (*) [2])in_stack_fffffffffffffb48);
        amrex::Print::~Print(in_stack_fffffffffffffbc0);
        std::__cxx11::string::~string(local_2e0);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffb50);
      }
      local_10 = "Replace \'mac\' prefix with \'mac_proj\' in inputs";
      amrex::Abort_host((char *)in_stack_fffffffffffffb60);
    }
    amrex::ExecOnFinalize((PTR_TO_VOID_FUNC)0x8455b7);
    (anonymous_namespace)::initialized = 1;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x8455cd);
    amrex::ParmParse::~ParmParse((ParmParse *)0x8455da);
  }
  return;
}

Assistant:

void
MacProj::Initialize ()
{
    if (initialized) return;
    //
    // Set defaults here!!!
    //
    umac_periodic_test_Tol          = 1.e-10;
    MacProj::verbose                = 0;
    MacProj::mac_tol                = 1.0e-12;
    MacProj::mac_abs_tol            = 1.0e-16;
    MacProj::mac_sync_tol           = 1.0e-10;
    MacProj::do_outflow_bcs         = 1;
    //
    // Only check umac periodicity when debugging.  Can be overridden on input.
    //
#ifndef AMREX_DEBUG
    MacProj::check_umac_periodicity = 0;
#else
    MacProj::check_umac_periodicity = 1;
#endif

    // NOTE: IAMR uses a different max_order default than hydro::MacProjector,
    // which uses a default of 3
    static int max_order = 4;
    static int agglomeration = 1;
    static int consolidation = 1;
    static int max_fmg_iter = -1;


    ParmParse pp("mac_proj");

    pp.query("verbose",                verbose);
    pp.query("mac_tol",                mac_tol);
    pp.query("mac_abs_tol",            mac_abs_tol);
    pp.query("mac_sync_tol",           mac_sync_tol);
    pp.query("do_outflow_bcs",         do_outflow_bcs);
    pp.query("check_umac_periodicity", check_umac_periodicity);
    pp.query("umac_periodic_test_Tol", umac_periodic_test_Tol);

    pp.query("agglomeration", agglomeration);
    pp.query("consolidation", consolidation);
    pp.query("max_fmg_iter", max_fmg_iter);
    pp.query( "maxorder"      , max_order );
#ifdef AMREX_USE_HYPRE
    if ( pp.contains("use_hypre") )
      amrex::Abort("use_hypre is no more. To use Hypre set mac_proj.bottom_solver = hypre.");
    if ( pp.contains("hypre_verbose") )
      amrex::Abort("hypre_verbose is no more. To make the bottom solver verbose set mac_proj.bottom_verbose = 1.");
#endif

    // Abort if old verbose flag is found
    if ( pp.countname("v") > 0 ) {
	amrex::Abort("mac_proj.v found in inputs. To set verbosity use mac_proj.verbose");
    }
    // Abort if old "mac." prefix is used.
    std::set<std::string> old_mac = ParmParse::getEntries("mac");
    if (!old_mac.empty()){
	Print()<<"All runtime options related to the mac projection now use 'mac_proj'.\n"
	       <<"Found these depreciated entries in the parameters list: \n";
	for ( auto param : old_mac ) {
	    Print()<<"  "<<param<<"\n";
	}
	amrex::Abort("Replace 'mac' prefix with 'mac_proj' in inputs");
    }

    amrex::ExecOnFinalize(MacProj::Finalize);

    initialized = true;
}